

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void __thiscall
andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
Geometry<unsigned_long*,unsigned_long_const*>
          (Geometry<std::allocator<unsigned_long>> *this,unsigned_long *begin,unsigned_long *end,
          unsigned_long *it,CoordinateOrder *internalCoordinateOrder,allocator_type *allocator)

{
  ulong uVar1;
  long *plVar2;
  unsigned_long uVar3;
  unsigned_long *puVar4;
  runtime_error *this_00;
  long lVar5;
  long lVar6;
  Geometry<std::allocator<unsigned_long>> GVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  unsigned_long *puVar11;
  
  lVar6 = (long)end - (long)begin >> 3;
  puVar4 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                     ((new_allocator<unsigned_long> *)this,lVar6 * 3,(void *)0x0);
  *(unsigned_long **)(this + 8) = puVar4;
  lVar5 = (long)end - (long)begin;
  plVar2 = (long *)((long)puVar4 + lVar5);
  *(long **)(this + 0x10) = plVar2;
  *(long **)(this + 0x18) = (long *)(lVar5 + (long)plVar2);
  *(long *)(this + 0x20) = lVar6;
  *(undefined8 *)(this + 0x28) = 1;
  *(CoordinateOrder *)(this + 0x30) = *internalCoordinateOrder;
  this[0x34] = (Geometry<std::allocator<unsigned_long>>)0x1;
  if (lVar5 != 0) {
    uVar9 = *(ulong *)(this + 0x20);
    if (uVar9 != 0) {
      uVar10 = 0;
      do {
        uVar3 = begin[uVar10];
        puVar4[uVar10] = uVar3;
        *(unsigned_long *)(this + 0x28) = uVar3 * *(long *)(this + 0x28);
        if (*(ulong *)(this + 0x20) <= uVar10) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"Assertion failed.");
          goto LAB_00126f43;
        }
        *(unsigned_long *)((long)puVar4 + uVar10 * 8 + (long)end * 2 + (long)begin * -2) =
             it[uVar10];
        uVar10 = uVar10 + 1;
        uVar9 = *(ulong *)(this + 0x20);
      } while (uVar10 < uVar9);
    }
    if (uVar9 == 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Assertion failed.");
LAB_00126f43:
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (*internalCoordinateOrder == FirstMajorOrder) {
      plVar2[uVar9 - 1] = 1;
      if (uVar9 != 1) {
        lVar6 = plVar2[uVar9 - 1];
        do {
          lVar6 = lVar6 * puVar4[uVar9 - 1];
          *(long *)((long)puVar4 + uVar9 * 8 + lVar5 + -0x10) = lVar6;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 1);
      }
    }
    else {
      *plVar2 = 1;
      if (uVar9 != 1) {
        lVar6 = *plVar2;
        lVar8 = uVar9 - 1;
        puVar11 = puVar4;
        do {
          lVar6 = lVar6 * *puVar11;
          *(long *)((long)puVar11 + lVar5 + 8) = lVar6;
          puVar11 = puVar11 + 1;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
    }
    uVar9 = *(ulong *)(this + 0x20);
    GVar7 = (Geometry<std::allocator<unsigned_long>>)0x1;
    if (uVar9 != 0) {
      if (*plVar2 == *(long *)(lVar5 + (long)plVar2)) {
        uVar10 = 0;
        do {
          if (uVar9 - 1 == uVar10) goto LAB_00126f14;
          lVar6 = uVar10 * 8;
          uVar1 = uVar10 + 1;
          lVar8 = uVar10 * 8;
          uVar10 = uVar1;
        } while (*(long *)((long)puVar4 + lVar6 + lVar5 + 8) ==
                 *(long *)((long)puVar4 + lVar8 + (long)end * 2 + (long)begin * -2 + 8));
        this[0x34] = (Geometry<std::allocator<unsigned_long>>)0x0;
        if (uVar1 < uVar9) {
          return;
        }
      }
      else {
        GVar7 = (Geometry<std::allocator<unsigned_long>>)0x0;
      }
    }
LAB_00126f14:
    this[0x34] = GVar7;
  }
  return;
}

Assistant:

inline
Geometry<A>::Geometry
(
    ShapeIterator begin, 
    ShapeIterator end,
    StrideIterator it,
    const CoordinateOrder& internalCoordinateOrder,
    const typename Geometry<A>::allocator_type& allocator
)
: allocator_(allocator),
  shape_(allocator_.allocate(std::distance(begin, end) * 3)), 
  shapeStrides_(shape_ + std::distance(begin, end)),
  strides_(shapeStrides_ + std::distance(begin, end)), 
  dimension_(std::distance(begin, end)),
  size_(1),
  coordinateOrder_(internalCoordinateOrder),
  isSimple_(true)
{
    if(dimension() != 0) {
        for(std::size_t j=0; j<dimension(); ++j, ++begin, ++it) {
            const std::size_t s = static_cast<std::size_t>(*begin);
            shape(j) = s;
            size() *= s;
            strides(j) = *it;
        }
        stridesFromShape(shapeBegin(), shapeEnd(), shapeStridesBegin(), 
            internalCoordinateOrder);
        updateSimplicity();
    }
}